

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O2

int loguru::init(EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  locale *__s;
  Text TVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  size_t __n;
  int iVar8;
  undefined8 *in_RDX;
  long lVar9;
  uint uVar10;
  undefined8 *in_RSI;
  ulong uVar11;
  char *pcVar12;
  double __x;
  double __x_00;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  Text fail_info;
  Text str_right;
  uint local_100;
  int local_fc;
  int val_right;
  int val_left;
  EVP_PKEY_CTX *local_f0;
  Text user_msg;
  Text str_left;
  sigset_t local_c0;
  byte local_40;
  
  val_left = *(int *)ctx;
  val_right = 0;
  local_f0 = ctx;
  if ((long)val_left < 1) {
    format_value<int>((loguru *)&str_left,&val_left);
    format_value<int>((loguru *)&str_right,&val_right);
    textprintf((loguru *)&fail_info,"CHECK FAILED:  %s %s %s  (%s %s %s)  ","argc",">","0",
               str_left._str,">");
    textprintf((loguru *)&user_msg,"Expected proper argc/argv");
    log_and_abort(0,fail_info._str,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/paulfauthmayer[P]schemeplusplus/include/loguru.cpp"
                  ,0x22b,"%s",user_msg._str);
  }
  if (in_RSI[val_left] != 0) {
    textprintf((loguru *)&str_left,"N/A");
    textprintf((loguru *)&str_right,"N/A");
    textprintf((loguru *)&fail_info,"CHECK FAILED:  %s %s %s  (%s %s %s)  ","argv[argc]","==",
               "nullptr",str_left._str,"==");
    textprintf((loguru *)&user_msg,"Expected proper argc/argv");
    log_and_abort(0,fail_info._str,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/paulfauthmayer[P]schemeplusplus/include/loguru.cpp"
                  ,0x22c,"%s",user_msg._str);
  }
  filename((char *)*in_RSI);
  std::__cxx11::string::assign((char *)&s_argv0_filename_abi_cxx11_);
  pcVar6 = getcwd(&s_current_dir,0x1000);
  if (pcVar6 == (char *)0x0) {
    errno_as_text();
    TVar2 = str_left;
    iVar8 = s_max_out_verbosity;
    if (s_max_out_verbosity < g_stderr_verbosity) {
      iVar8 = g_stderr_verbosity;
    }
    if (-2 < iVar8) {
      log(__x);
    }
    free(TVar2._str);
  }
  pcVar6 = "";
  __x_00 = (double)std::__cxx11::string::assign((char *)&s_arguments_abi_cxx11_);
  lVar9 = 0;
  while( true ) {
    local_100 = *(uint *)local_f0;
    uVar7 = (ulong)(int)local_100;
    if ((long)uVar7 <= lVar9) break;
    pcVar6 = (char *)in_RSI[lVar9];
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str_left,pcVar6,(allocator<char> *)&str_right);
    uVar7 = local_c0.__val[0];
    TVar2 = str_left;
    for (uVar11 = 0; uVar7 != uVar11; uVar11 = uVar11 + 1) {
      bVar1 = TVar2._str[uVar11];
      pcVar6 = "\\a";
      switch(bVar1) {
      case 7:
        break;
      case 8:
        pcVar6 = "\\b";
        break;
      case 9:
        pcVar6 = "\\t";
        break;
      case 10:
        pcVar6 = "\\n";
        break;
      case 0xb:
        pcVar6 = "\\v";
        break;
      case 0xc:
        pcVar6 = "\\f";
        break;
      case 0xd:
        pcVar6 = "\\r";
        break;
      default:
        if (bVar1 == 0x20) {
          pcVar6 = "\\ ";
          break;
        }
        if (bVar1 == 0x22) {
          pcVar6 = "\\\"";
          break;
        }
        uVar10 = (uint)bVar1;
        if (uVar10 == 0x27) {
          pcVar6 = "\\\'";
          break;
        }
        if (uVar10 == 0x5c) {
          pcVar6 = "\\\\";
          break;
        }
        if (bVar1 < 0x20) {
          pcVar6 = "\\x";
          std::__cxx11::string::append((char *)&s_arguments_abi_cxx11_);
          write_hex_digit((string *)(ulong)(bVar1 >> 4),(uint)pcVar6);
          write_hex_digit((string *)(ulong)(uVar10 & 0xf),(uint)pcVar6);
        }
        else {
          pcVar6 = (char *)(ulong)(uint)(int)(char)bVar1;
          std::__cxx11::string::push_back('\x18');
        }
        goto LAB_0012247b;
      }
      std::__cxx11::string::append((char *)&s_arguments_abi_cxx11_);
LAB_0012247b:
    }
    __x_00 = (double)std::__cxx11::string::~string((string *)&str_left);
    lVar9 = lVar9 + 1;
    if ((int)lVar9 < (int)*(uint *)local_f0) {
      pcVar6 = " ";
      __x_00 = (double)std::__cxx11::string::append((char *)&s_arguments_abi_cxx11_);
    }
  }
  __s = (locale *)*in_RDX;
  if (__s != (locale *)0x0) {
    local_fc = 1;
    for (iVar8 = 1; iVar8 < (int)uVar7; iVar8 = iVar8 + 1) {
      pcVar12 = (char *)in_RSI[iVar8];
      __n = strlen((char *)__s);
      pcVar6 = (char *)__s;
      iVar5 = strncmp(pcVar12,(char *)__s,__n);
      __x_00 = extraout_XMM0_Qa;
      if (iVar5 == 0) {
        cVar4 = pcVar12[__n];
        std::locale::locale((locale *)&str_left,"");
        pcVar6 = (char *)&str_left;
        bVar3 = std::isalpha<char>(cVar4,(locale *)&str_left);
        __x_00 = (double)std::locale::~locale((locale *)&str_left);
        if (bVar3) {
          pcVar12 = (char *)in_RSI[iVar8];
          goto LAB_00122598;
        }
        pcVar12 = pcVar12 + __n;
        cVar4 = *pcVar12;
        if (cVar4 == '\0') {
          val_left = iVar8 + 1;
          val_right = *(int *)local_f0;
          if (val_right <= val_left) {
            format_value<int>((loguru *)&str_left,&val_left);
            format_value<int>((loguru *)&str_right,&val_right);
            textprintf((loguru *)&fail_info,"CHECK FAILED:  %s %s %s  (%s %s %s)  ","arg_it","<",
                       "argc",str_left._str,"<");
            textprintf((loguru *)&user_msg,"Missing verbosiy level after %s",__s,str_right._str);
            log_and_abort(0,fail_info._str,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/paulfauthmayer[P]schemeplusplus/include/loguru.cpp"
                          ,0x1c1,"%s",user_msg._str);
          }
          pcVar12 = (char *)in_RSI[val_left];
          local_100 = local_100 - 2;
          cVar4 = *pcVar12;
          iVar8 = val_left;
        }
        else {
          local_100 = local_100 - 1;
        }
        pcVar12 = pcVar12 + (cVar4 == '=');
        iVar5 = get_verbosity_from_name(pcVar12);
        __x_00 = extraout_XMM0_Qa_00;
        if (iVar5 == -10) {
          str_left._str = (char *)0x0;
          pcVar6 = (char *)&str_left;
          lVar9 = strtol(pcVar12,(char **)&str_left,10);
          g_stderr_verbosity = (int)lVar9;
          if ((str_left._str == (char *)0x0) ||
             (__x_00 = extraout_XMM0_Qa_01, iVar5 = g_stderr_verbosity, *str_left._str != '\0')) {
            log_and_abort(0,"CHECK FAILED:  end && *end == \'\\0\'  ",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/paulfauthmayer[P]schemeplusplus/include/loguru.cpp"
                          ,0x1ce,
                          "Invalid verbosity. Expected integer, INFO, WARNING, ERROR or OFF, got \'%s\'"
                          ,pcVar12);
          }
        }
      }
      else {
LAB_00122598:
        lVar9 = (long)local_fc;
        local_fc = local_fc + 1;
        in_RSI[lVar9] = pcVar12;
        iVar5 = g_stderr_verbosity;
      }
      g_stderr_verbosity = iVar5;
      uVar7 = (ulong)*(uint *)local_f0;
    }
    *(uint *)local_f0 = local_100;
    in_RSI[(int)local_100] = 0;
  }
  if ((char *)in_RDX[1] != (char *)0x0) {
    set_thread_name((char *)in_RDX[1]);
    __x_00 = extraout_XMM0_Qa_02;
  }
  if (-1 < g_stderr_verbosity) {
    if (g_preamble_header == '\x01') {
      print_preamble_header((char *)&str_left,(size_t)pcVar6);
      if ((g_colorlogtostderr == '\x01') && (s_terminal_has_color == '\x01')) {
        fprintf(_stderr,"%s%s%s\n","\x1b[0m","\x1b[2m",&str_left);
      }
      else {
        fprintf(_stderr,"%s\n",&str_left);
      }
    }
    fflush(_stderr);
    __x_00 = extraout_XMM0_Qa_03;
  }
  iVar8 = s_max_out_verbosity;
  if (s_max_out_verbosity < g_stderr_verbosity) {
    iVar8 = g_stderr_verbosity;
  }
  if (g_internal_verbosity <= iVar8) {
    __x_00 = log(__x_00);
  }
  iVar8 = s_max_out_verbosity;
  if (s_max_out_verbosity < g_stderr_verbosity) {
    iVar8 = g_stderr_verbosity;
  }
  if ((s_current_dir != '\0') && (g_internal_verbosity <= iVar8)) {
    __x_00 = log(__x_00);
  }
  iVar8 = s_max_out_verbosity;
  if (s_max_out_verbosity < g_stderr_verbosity) {
    iVar8 = g_stderr_verbosity;
  }
  if ((g_internal_verbosity <= iVar8) &&
     (__x_00 = log(__x_00), iVar8 = s_max_out_verbosity, s_max_out_verbosity < g_stderr_verbosity))
  {
    iVar8 = g_stderr_verbosity;
  }
  if (g_internal_verbosity <= iVar8) {
    log(__x_00);
  }
  _s_signal_options = in_RDX[2];
  memset(&str_left,0,0x98);
  sigemptyset(&local_c0);
  local_40 = local_40 | 4;
  str_left._str = (char *)signal_handler;
  if ((*(char *)((long)in_RDX + 0x11) == '\x01') &&
     (iVar8 = sigaction(6,(sigaction *)&str_left,(sigaction *)0x0), iVar8 == -1)) {
    pcVar6 = "CHECK FAILED:  sigaction(SIGABRT, &sig_action, NULL) != -1  ";
    pcVar12 = "Failed to install handler for SIGABRT";
    uVar10 = 0x738;
  }
  else if ((*(char *)((long)in_RDX + 0x12) == '\x01') &&
          (iVar8 = sigaction(7,(sigaction *)&str_left,(sigaction *)0x0), iVar8 == -1)) {
    pcVar6 = "CHECK FAILED:  sigaction(SIGBUS, &sig_action, NULL) != -1  ";
    pcVar12 = "Failed to install handler for SIGBUS";
    uVar10 = 0x73b;
  }
  else if ((*(char *)((long)in_RDX + 0x13) == '\x01') &&
          (iVar8 = sigaction(8,(sigaction *)&str_left,(sigaction *)0x0), iVar8 == -1)) {
    pcVar6 = "CHECK FAILED:  sigaction(SIGFPE, &sig_action, NULL) != -1  ";
    pcVar12 = "Failed to install handler for SIGFPE";
    uVar10 = 0x73e;
  }
  else if ((*(char *)((long)in_RDX + 0x14) == '\x01') &&
          (iVar8 = sigaction(4,(sigaction *)&str_left,(sigaction *)0x0), iVar8 == -1)) {
    pcVar6 = "CHECK FAILED:  sigaction(SIGILL, &sig_action, NULL) != -1  ";
    pcVar12 = "Failed to install handler for SIGILL";
    uVar10 = 0x741;
  }
  else if ((*(char *)((long)in_RDX + 0x15) == '\x01') &&
          (iVar8 = sigaction(2,(sigaction *)&str_left,(sigaction *)0x0), iVar8 == -1)) {
    pcVar6 = "CHECK FAILED:  sigaction(SIGINT, &sig_action, NULL) != -1  ";
    pcVar12 = "Failed to install handler for SIGINT";
    uVar10 = 0x744;
  }
  else if ((*(char *)((long)in_RDX + 0x16) == '\x01') &&
          (iVar8 = sigaction(0xb,(sigaction *)&str_left,(sigaction *)0x0), iVar8 == -1)) {
    pcVar6 = "CHECK FAILED:  sigaction(SIGSEGV, &sig_action, NULL) != -1  ";
    pcVar12 = "Failed to install handler for SIGSEGV";
    uVar10 = 0x747;
  }
  else {
    if ((*(char *)((long)in_RDX + 0x17) != '\x01') ||
       (iVar8 = sigaction(0xf,(sigaction *)&str_left,(sigaction *)0x0), iVar8 != -1)) {
      iVar8 = atexit(on_atexit);
      return iVar8;
    }
    pcVar6 = "CHECK FAILED:  sigaction(SIGTERM, &sig_action, NULL) != -1  ";
    pcVar12 = "Failed to install handler for SIGTERM";
    uVar10 = 0x74a;
  }
  log_and_abort(0,pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/paulfauthmayer[P]schemeplusplus/include/loguru.cpp"
                ,uVar10,pcVar12);
}

Assistant:

void init(int& argc, char* argv[], const Options& options)
	{
		CHECK_GT_F(argc,       0,       "Expected proper argc/argv");
		CHECK_EQ_F(argv[argc], nullptr, "Expected proper argc/argv");

		s_argv0_filename = filename(argv[0]);

		#ifdef _WIN32
			#define getcwd _getcwd
		#endif

		if (!getcwd(s_current_dir, sizeof(s_current_dir))) {
			const auto error_text = errno_as_text();
			LOG_F(WARNING, "Failed to get current working directory: " LOGURU_FMT(s) "", error_text.c_str());
		}

		s_arguments = "";
		for (int i = 0; i < argc; ++i) {
			escape(s_arguments, argv[i]);
			if (i + 1 < argc) {
				s_arguments += " ";
			}
		}

		if (options.verbosity_flag) {
			parse_args(argc, argv, options.verbosity_flag);
		}

		if (const auto main_thread_name = options.main_thread_name) {
			#if LOGURU_PTLS_NAMES || LOGURU_WINTHREADS
				set_thread_name(main_thread_name);
			#elif LOGURU_PTHREADS
				char old_thread_name[16] = {0};
				auto this_thread = pthread_self();
				#if defined(__APPLE__) || defined(__linux__) || defined(__sun)
					pthread_getname_np(this_thread, old_thread_name, sizeof(old_thread_name));
				#endif
				if (old_thread_name[0] == 0) {
					#ifdef __APPLE__
						pthread_setname_np(main_thread_name);
					#elif defined(__FreeBSD__) || defined(__OpenBSD__)
						pthread_set_name_np(this_thread, main_thread_name);
					#elif defined(__linux__) || defined(__sun)
						pthread_setname_np(this_thread, main_thread_name);
					#endif
				}
			#endif // LOGURU_PTHREADS
		}

		if (g_stderr_verbosity >= Verbosity_INFO) {
			if (g_preamble_header) {
				char preamble_explain[LOGURU_PREAMBLE_WIDTH];
				print_preamble_header(preamble_explain, sizeof(preamble_explain));
				if (g_colorlogtostderr && s_terminal_has_color) {
					fprintf(stderr, "%s%s%s\n", terminal_reset(), terminal_dim(), preamble_explain);
				} else {
					fprintf(stderr, "%s\n", preamble_explain);
				}
			}
			fflush(stderr);
		}
		VLOG_F(g_internal_verbosity, "arguments: " LOGURU_FMT(s) "", s_arguments.c_str());
		if (strlen(s_current_dir) != 0)
		{
			VLOG_F(g_internal_verbosity, "Current dir: " LOGURU_FMT(s) "", s_current_dir);
		}
		VLOG_F(g_internal_verbosity, "stderr verbosity: " LOGURU_FMT(d) "", g_stderr_verbosity);
		VLOG_F(g_internal_verbosity, "-----------------------------------");

		install_signal_handlers(options.signals);

		atexit(on_atexit);
	}